

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::LargeHeapBlock::EnumerateObjects
          (LargeHeapBlock *this,ObjectInfoBits infoBits,_func_void_void_ptr_size_t *CallBackFunction
          )

{
  byte bVar1;
  LargeObjectHeader *this_00;
  void *pvVar2;
  LargeObjectHeader *header;
  uint i;
  _func_void_void_ptr_size_t *CallBackFunction_local;
  ObjectInfoBits infoBits_local;
  LargeHeapBlock *this_local;
  
  for (header._4_4_ = 0; header._4_4_ < this->allocCount; header._4_4_ = header._4_4_ + 1) {
    this_00 = GetHeaderByIndex(this,header._4_4_);
    if ((this_00 != (LargeObjectHeader *)0x0) &&
       (bVar1 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie),
       (bVar1 & infoBits) != NoBit)) {
      pvVar2 = LargeObjectHeader::GetAddress(this_00);
      (*CallBackFunction)(pvVar2,this_00->objectSize);
    }
  }
  return;
}

Assistant:

void
LargeHeapBlock::EnumerateObjects(ObjectInfoBits infoBits, void (*CallBackFunction)(void * address, size_t size))
{
    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->GetHeaderByIndex(i);
        if (header == nullptr)
        {
            continue;
        }
        if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & infoBits) != 0)
        {
            CallBackFunction(header->GetAddress(), header->objectSize);
        }
    }
}